

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFEmitter.cpp
# Opt level: O0

void EmitFileEntry(raw_ostream *OS,File *File)

{
  char *pcVar1;
  void *__buf;
  size_t in_RCX;
  void *__buf_00;
  File *File_local;
  raw_ostream *OS_local;
  
  pcVar1 = llvm::StringRef::data(&File->Name);
  __buf = (void *)llvm::StringRef::size(&File->Name);
  llvm::raw_ostream::write(OS,(int)pcVar1,__buf,in_RCX);
  llvm::raw_ostream::write(OS,0,__buf_00,in_RCX);
  llvm::encodeULEB128(File->DirIdx,OS,0);
  llvm::encodeULEB128(File->ModTime,OS,0);
  llvm::encodeULEB128(File->Length,OS,0);
  return;
}

Assistant:

static void EmitFileEntry(raw_ostream &OS, const DWARFYAML::File &File) {
  OS.write(File.Name.data(), File.Name.size());
  OS.write('\0');
  encodeULEB128(File.DirIdx, OS);
  encodeULEB128(File.ModTime, OS);
  encodeULEB128(File.Length, OS);
}